

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::update(Texture *this,Window *window,uint x,uint y)

{
  Uint64 UVar1;
  PFNGLCOPYTEXSUBIMAGE2DPROC p_Var2;
  bool bVar3;
  Vector2u VVar4;
  Vector2u VVar5;
  TransientContextLock lock;
  TextureSaver save;
  Lock lock_1;
  
  if (this->m_texture != 0) {
    bVar3 = Window::setActive(window,true);
    if (bVar3) {
      GlResource::TransientContextLock::TransientContextLock(&lock);
      priv::TextureSaver::TextureSaver(&save);
      (*sf_glad_glBindTexture)(0xde1,this->m_texture);
      p_Var2 = sf_glad_glCopyTexSubImage2D;
      VVar4 = WindowBase::getSize(&window->super_WindowBase);
      VVar5 = WindowBase::getSize(&window->super_WindowBase);
      (*p_Var2)(0xde1,0,x,y,0,0,VVar4.x,VVar5.y);
      (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
      this->m_hasMipmap = false;
      this->m_pixelsFlipped = true;
      Lock::Lock(&lock_1,(Mutex *)&(anonymous_namespace)::TextureImpl::idMutex);
      UVar1 = (anonymous_namespace)::TextureImpl::getUniqueId()::id;
      (anonymous_namespace)::TextureImpl::getUniqueId()::id =
           (anonymous_namespace)::TextureImpl::getUniqueId()::id + 1;
      Lock::~Lock(&lock_1);
      this->m_cacheId = UVar1;
      (*sf_glad_glFlush)();
      priv::TextureSaver::~TextureSaver(&save);
      GlResource::TransientContextLock::~TransientContextLock(&lock);
    }
  }
  return;
}

Assistant:

void Texture::update(const Window& window, unsigned int x, unsigned int y)
{
    assert(x + window.getSize().x <= m_size.x);
    assert(y + window.getSize().y <= m_size.y);

    if (m_texture && window.setActive(true))
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the back-buffer to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glCopyTexSubImage2D(GL_TEXTURE_2D, 0, static_cast<GLint>(x), static_cast<GLint>(y), 0, 0, static_cast<GLsizei>(window.getSize().x), static_cast<GLsizei>(window.getSize().y)));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = true;
        m_cacheId = TextureImpl::getUniqueId();

        // Force an OpenGL flush, so that the texture will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}